

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

void tcache_destroy(tsd_t *tsd,tcache_t *tcache,_Bool tsd_tcache)

{
  long *plVar1;
  rtree_ctx_cache_elm_t *prVar2;
  undefined8 *puVar3;
  tcache_slow_t *tcache_slow;
  arena_t *arena;
  void *ptr;
  void *pvVar4;
  rtree_leaf_elm_t *prVar5;
  _Bool _Var6;
  uint uVar7;
  rtree_leaf_elm_t *prVar8;
  undefined7 in_register_00000011;
  tcache_t *tcache_00;
  rtree_leaf_elm_t *extraout_RDX;
  rtree_leaf_elm_t *extraout_RDX_00;
  rtree_leaf_elm_t *extraout_RDX_01;
  rtree_leaf_elm_t *extraout_RDX_02;
  rtree_leaf_elm_t *extraout_RDX_03;
  ulong uVar9;
  rtree_leaf_elm_t *extraout_RDX_04;
  rtree_leaf_elm_t *extraout_RDX_05;
  rtree_leaf_elm_t *prVar10;
  rtree_leaf_elm_t *extraout_RDX_06;
  ulong uVar11;
  atomic_p_t arena_00;
  rtree_ctx_cache_elm_t *prVar12;
  rtree_ctx_cache_elm_t *prVar13;
  rtree_ctx_t *prVar14;
  rtree_leaf_elm_t *prVar15;
  bool bVar16;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1b0;
  
  tcache_slow = tcache->tcache_slow;
  tcache_flush_cache(tsd,tcache);
  arena = tcache_slow->arena;
  tcache_arena_dissociate((tsdn_t *)tsd,tcache_slow,tcache_00);
  prVar10 = extraout_RDX;
  if (((int)CONCAT71(in_register_00000011,tsd_tcache) == 0) ||
     (_Var6 = duckdb_je_cache_bin_stack_use_thp(), prVar10 = extraout_RDX_00, !_Var6)) {
    ptr = tcache_slow->dyn_alloc;
    if (tsd == (tsd_t *)0x0) {
      prVar14 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar14);
      prVar10 = extraout_RDX_01;
    }
    else {
      prVar14 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar7 = (uint)((ulong)ptr >> 0x1e) & 0xf;
    prVar15 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
    puVar3 = (undefined8 *)((long)&prVar14->cache[0].leafkey + (ulong)(uVar7 << 4));
    prVar8 = *(rtree_leaf_elm_t **)((long)&prVar14->cache[0].leafkey + (ulong)(uVar7 << 4));
    if (prVar8 == prVar15) {
      prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar3[1]);
    }
    else if ((rtree_leaf_elm_t *)prVar14->l2_cache[0].leafkey == prVar15) {
      prVar10 = prVar14->l2_cache[0].leaf;
      prVar14->l2_cache[0].leafkey = (uintptr_t)prVar8;
      prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar15;
      puVar3[1] = prVar10;
      prVar8 = (rtree_leaf_elm_t *)
               ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      prVar12 = prVar14->l2_cache + 1;
      if ((rtree_leaf_elm_t *)prVar14->l2_cache[1].leafkey == prVar15) {
        uVar9 = 0;
        bVar16 = false;
      }
      else {
        uVar11 = 1;
        prVar13 = prVar12;
        do {
          uVar9 = uVar11;
          bVar16 = 6 < uVar9;
          if (uVar9 == 7) {
            prVar10 = (rtree_leaf_elm_t *)0x7;
            goto LAB_011a5f88;
          }
          prVar12 = prVar13 + 1;
          prVar2 = prVar13 + 1;
          uVar11 = uVar9 + 1;
          prVar13 = prVar12;
        } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar15);
        bVar16 = 6 < uVar9;
      }
      prVar5 = prVar12->leaf;
      prVar10 = (rtree_leaf_elm_t *)(uVar9 * 0x10);
      prVar12->leafkey = prVar14->l2_cache[uVar9].leafkey;
      prVar12->leaf = prVar14->l2_cache[uVar9].leaf;
      prVar14->l2_cache[uVar9].leafkey = (uintptr_t)prVar8;
      prVar14->l2_cache[uVar9].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar15;
      puVar3[1] = prVar5;
      prVar8 = (rtree_leaf_elm_t *)
               ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_011a5f88:
      if (bVar16) {
        prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                           ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar14,(uintptr_t)ptr,
                            true,false);
        prVar10 = extraout_RDX_04;
      }
    }
    pvVar4 = duckdb_je_arenas
             [*(uint *)(((long)(prVar8->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff
             ].repr;
    if (tsd == (tsd_t *)0x0) {
      prVar14 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar14);
      prVar10 = extraout_RDX_02;
    }
    else {
      prVar14 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    puVar3 = (undefined8 *)((long)&prVar14->cache[0].leafkey + (ulong)(uVar7 << 4));
    prVar8 = *(rtree_leaf_elm_t **)((long)&prVar14->cache[0].leafkey + (ulong)(uVar7 << 4));
    if (prVar8 == prVar15) {
      prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar3[1]);
    }
    else if ((rtree_leaf_elm_t *)prVar14->l2_cache[0].leafkey == prVar15) {
      prVar10 = prVar14->l2_cache[0].leaf;
      prVar14->l2_cache[0].leafkey = (uintptr_t)prVar8;
      prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar15;
      puVar3[1] = prVar10;
      prVar8 = (rtree_leaf_elm_t *)
               ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      prVar12 = prVar14->l2_cache + 1;
      if ((rtree_leaf_elm_t *)prVar14->l2_cache[1].leafkey == prVar15) {
        uVar9 = 0;
        bVar16 = false;
      }
      else {
        uVar11 = 1;
        prVar13 = prVar12;
        do {
          uVar9 = uVar11;
          bVar16 = 6 < uVar9;
          if (uVar9 == 7) {
            prVar10 = (rtree_leaf_elm_t *)0x7;
            goto LAB_011a6010;
          }
          prVar12 = prVar13 + 1;
          prVar2 = prVar13 + 1;
          uVar11 = uVar9 + 1;
          prVar13 = prVar12;
        } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar15);
        bVar16 = 6 < uVar9;
      }
      prVar5 = prVar12->leaf;
      prVar10 = (rtree_leaf_elm_t *)(uVar9 * 0x10);
      prVar12->leafkey = prVar14->l2_cache[uVar9].leafkey;
      prVar12->leaf = prVar14->l2_cache[uVar9].leaf;
      prVar14->l2_cache[uVar9].leafkey = (uintptr_t)prVar8;
      prVar14->l2_cache[uVar9].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar15;
      puVar3[1] = prVar5;
      prVar8 = (rtree_leaf_elm_t *)
               ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_011a6010:
      if (bVar16) {
        prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                           ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar14,(uintptr_t)ptr,
                            true,false);
        prVar10 = extraout_RDX_05;
      }
    }
    LOCK();
    plVar1 = (long *)((long)pvVar4 + 0x48);
    *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar8->le_bits).repr >> 0x30];
    UNLOCK();
    if (tsd == (tsd_t *)0x0) {
      prVar14 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar14);
      prVar10 = extraout_RDX_03;
    }
    else {
      prVar14 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    puVar3 = (undefined8 *)((long)&prVar14->cache[0].leafkey + (ulong)(uVar7 << 4));
    prVar8 = *(rtree_leaf_elm_t **)((long)&prVar14->cache[0].leafkey + (ulong)(uVar7 << 4));
    if (prVar8 == prVar15) {
      prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar3[1]);
    }
    else if ((rtree_leaf_elm_t *)prVar14->l2_cache[0].leafkey == prVar15) {
      prVar10 = prVar14->l2_cache[0].leaf;
      prVar14->l2_cache[0].leafkey = (uintptr_t)prVar8;
      prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar15;
      puVar3[1] = prVar10;
      prVar8 = (rtree_leaf_elm_t *)
               ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      prVar12 = prVar14->l2_cache + 1;
      if ((rtree_leaf_elm_t *)prVar14->l2_cache[1].leafkey == prVar15) {
        uVar11 = 0;
        bVar16 = false;
      }
      else {
        uVar11 = 0;
        prVar13 = prVar12;
        do {
          if (uVar11 == 6) {
            bVar16 = true;
            prVar10 = (rtree_leaf_elm_t *)0x6;
            goto LAB_011a6098;
          }
          prVar12 = prVar13 + 1;
          uVar11 = uVar11 + 1;
          prVar2 = prVar13 + 1;
          prVar13 = prVar12;
        } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar15);
        bVar16 = 6 < uVar11;
      }
      prVar5 = prVar12->leaf;
      prVar10 = (rtree_leaf_elm_t *)(uVar11 * 0x10);
      prVar12->leafkey = prVar14->l2_cache[uVar11].leafkey;
      prVar12->leaf = prVar14->l2_cache[uVar11].leaf;
      prVar14->l2_cache[uVar11].leafkey = (uintptr_t)prVar8;
      prVar14->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar15;
      puVar3[1] = prVar5;
      prVar8 = (rtree_leaf_elm_t *)
               ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_011a6098:
      if (bVar16) {
        prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                           ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar14,(uintptr_t)ptr,
                            true,false);
        prVar10 = extraout_RDX_06;
      }
    }
    if (((ulong)(prVar8->le_bits).repr & 1) == 0) {
      arena_dalloc_large_no_tcache((tsdn_t *)tsd,ptr,(szind_t)prVar10);
    }
    else {
      duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
    }
  }
  else {
    duckdb_je_b0_dalloc_tcache_stack((tsdn_t *)tsd,tcache_slow->dyn_alloc);
  }
  arena_00.repr = duckdb_je_arenas[0].repr;
  if (duckdb_je_arenas[0].repr == (void *)0x0) {
    arena_00.repr = (arena_t *)0x0;
  }
  duckdb_je_arena_decay((tsdn_t *)tsd,(arena_t *)arena_00.repr,false,false);
  uVar7 = duckdb_je_arena_nthreads_get(arena,false);
  if ((uVar7 != 0) || (_Var6 = true, (duckdb_je_background_thread_enabled_state.repr & 1U) != 0)) {
    _Var6 = false;
  }
  duckdb_je_arena_decay((tsdn_t *)tsd,arena,false,_Var6);
  return;
}

Assistant:

static void
tcache_destroy(tsd_t *tsd, tcache_t *tcache, bool tsd_tcache) {
	tcache_slow_t *tcache_slow = tcache->tcache_slow;
	tcache_flush_cache(tsd, tcache);
	arena_t *arena = tcache_slow->arena;
	tcache_arena_dissociate(tsd_tsdn(tsd), tcache_slow, tcache);

	if (tsd_tcache) {
		cache_bin_t *cache_bin = &tcache->bins[0];
		cache_bin_assert_empty(cache_bin);
	}
	if (tsd_tcache && cache_bin_stack_use_thp()) {
		b0_dalloc_tcache_stack(tsd_tsdn(tsd), tcache_slow->dyn_alloc);
	} else {
		idalloctm(tsd_tsdn(tsd), tcache_slow->dyn_alloc, NULL, NULL,
		    true, true);
	}

	/*
	 * The deallocation and tcache flush above may not trigger decay since
	 * we are on the tcache shutdown path (potentially with non-nominal
	 * tsd).  Manually trigger decay to avoid pathological cases.  Also
	 * include arena 0 because the tcache array is allocated from it.
	 */
	arena_decay(tsd_tsdn(tsd), arena_get(tsd_tsdn(tsd), 0, false),
	    false, false);

	if (arena_nthreads_get(arena, false) == 0 &&
	    !background_thread_enabled()) {
		/* Force purging when no threads assigned to the arena anymore. */
		arena_decay(tsd_tsdn(tsd), arena,
		    /* is_background_thread */ false, /* all */ true);
	} else {
		arena_decay(tsd_tsdn(tsd), arena,
		    /* is_background_thread */ false, /* all */ false);
	}
}